

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitTable(PrintSExpression *this,Table *curr)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = (curr->super_Importable).module.super_IString.str._M_str;
  doIndent(this->o,this->indent);
  if (pcVar1 == (char *)0x0) {
    printTableHeader(this,curr);
    poVar2 = this->o;
  }
  else {
    std::operator<<(this->o,'(');
    emitImportHeader(this,&curr->super_Importable);
    printTableHeader(this,curr);
    poVar2 = std::operator<<(this->o,')');
  }
  std::operator<<(poVar2,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitTable(Table* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printTableHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printTableHeader(curr);
    o << maybeNewLine;
  }
}